

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O2

void __thiscall
google::protobuf::internal::MicroString::set_inline_size(MicroString *this,size_t size)

{
  if (size << 2 < 0x100) {
    this->rep_ = (void *)((ulong)this->rep_ & 0xffffffffffffff00 | size << 2);
    return;
  }
  protobuf_assumption_failed
            ("size <= 0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
             ,0x171);
}

Assistant:

void set_inline_size(size_t size) {
    size <<= kTagShift;
    PROTOBUF_ASSUME(size <= 0xFF);
    // Only overwrite the size byte to avoid clobbering the char bytes in case
    // of aliasing.
    rep_ = reinterpret_cast<void*>((reinterpret_cast<uintptr_t>(rep_) & ~0xFF) |
                                   size);
    ABSL_DCHECK(is_inline());
  }